

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildBrProperty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint functionId;
  PropertyId propertyId;
  undefined4 *puVar5;
  OpLayoutBrProperty *pOVar6;
  JITTimeFunctionBody *pJVar7;
  FunctionJITTimeInfo *this_00;
  SymOpnd *srcOpnd;
  BranchInstr *branchInstr;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1cf6,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::BrProperty(&this->m_jnReader);
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar7);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ClosureRegCheckPhase,uVar4,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,pOVar6->Instance);
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(pJVar7,pOVar6->PropertyIdIndex);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar6->RelativeJumpOffset;
  srcOpnd = BuildFieldOpnd(this,newOpcode,pOVar6->Instance,propertyId,pOVar6->PropertyIdIndex,
                           PropertyKindData,0xffffffff);
  branchInstr = IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,&srcOpnd->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,(int)sVar1 + uVar4);
  return;
}

Assistant:

void
IRBuilder::BuildBrProperty(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    const unaligned   Js::OpLayoutBrProperty *branchInsn = m_jnReader.BrProperty();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(branchInsn->Instance);
    }

    IR::BranchInstr * branchInstr;
    Js::PropertyId    propertyId =
        m_func->GetJITFunctionBody()->GetReferencedPropertyId(branchInsn->PropertyIdIndex);
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
    IR::SymOpnd *     fieldSymOpnd = this->BuildFieldOpnd(newOpcode, branchInsn->Instance, propertyId, branchInsn->PropertyIdIndex, PropertyKindData);

    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, fieldSymOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}